

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.h
# Opt level: O0

void __thiscall RenX::ExemptionDatabase::Entry::~Entry(Entry *this)

{
  Entry *this_local;
  
  std::__cxx11::string::~string((string *)&this->setter);
  return;
}

Assistant:

struct RENX_API Entry
		{
			fpos_t pos; /** Position of the entry in the database */
			uint8_t flags /** Flags affecting this exemption entry (See below for flags) */ = 0x00;
			std::chrono::system_clock::time_point timestamp /** Time the exemption was created */;
			std::chrono::seconds length /** Duration of the exemption; 0 if permanent */;
			uint64_t steamid /** SteamID of the exempted player */;
			uint32_t ip /** IPv4 address of the exempted player */;
			uint8_t prefix_length /** Prefix length for the IPv4 address block */;
			std::string setter /** Name of the user who added the exemption */;

			static const uint8_t FLAG_ACTIVE = 0x80;
			static const uint8_t FLAG_USE_IP = 0x40;
			static const uint8_t FLAG_TYPE_KICK = 0x04;
			static const uint8_t FLAG_TYPE_BAN = 0x02;

			inline bool is_active() { return (flags & FLAG_ACTIVE) != 0; };
			inline bool is_ip_exemption() { return (flags & FLAG_USE_IP) != 0; };
			inline bool is_type_kick() { return (flags & FLAG_TYPE_KICK) != 0; };
			inline bool is_type_ban() { return (flags & FLAG_TYPE_BAN) != 0; };

			inline void set_active() { flags |= FLAG_ACTIVE; };
			inline void set_ip_exemption() { flags |= FLAG_USE_IP; };
			inline void set_type_kick() { flags |= FLAG_TYPE_KICK; };
			inline void set_type_ban() { flags |= FLAG_TYPE_BAN; };

			inline void unset_active() { flags &= ~FLAG_ACTIVE; };
			inline void unset_ip_exemption() { flags &= ~FLAG_USE_IP; };
			inline void unset_type_kick() { flags &= ~FLAG_TYPE_KICK; };
			inline void unset_type_ban() { flags &= ~FLAG_TYPE_BAN; };
		}